

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O1

void __thiscall
InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (InterleavedSudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields,
          int maxPossible,bool fixFieldChooseRandomly,bool debug)

{
  pointer psVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  undefined7 in_register_00000009;
  shared_ptr<Field> *field;
  pointer psVar10;
  ulong uVar11;
  
  if ((int)CONCAT71(in_register_00000009,fixFieldChooseRandomly) == 0) {
    psVar10 = (testFields->
              super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    psVar1 = (testFields->
             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (psVar10 == psVar1) {
      iVar7 = 0;
      iVar4 = 0;
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      iVar4 = 0;
      iVar7 = 0;
      do {
        iVar5 = Field::value((psVar10->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            );
        iVar6 = 5;
        if (iVar5 == 0) {
          iVar5 = Field::n_possible((psVar10->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)
                                    ._M_ptr);
          iVar6 = 0;
          if (iVar5 == maxPossible) {
            iVar3 = Field::pos_x((psVar10->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
            iVar4 = Field::pos_y((psVar10->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
            iVar7 = Field::pos_z((psVar10->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
            iVar6 = 4;
          }
        }
      } while (((iVar6 == 5) || (iVar6 == 0)) && (psVar10 = psVar10 + 1, psVar10 != psVar1));
    }
  }
  else {
    iVar7 = 0;
    uVar11 = 0;
    do {
      iVar3 = rand();
      iVar3 = iVar3 % (this->super_Sudoku).squared_size_;
      iVar4 = rand();
      uVar2 = (long)iVar4 % (long)(this->super_Sudoku).squared_size_;
      iVar5 = rand();
      iVar4 = (this->super_Sudoku).squared_size_;
      iVar6 = Field::value((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start
                           [(iVar4 * (iVar5 % 2) + (int)uVar2) * iVar4 + iVar3].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (iVar6 == 0) {
        uVar11 = uVar2 & 0xffffffff;
        iVar7 = iVar5 % 2;
      }
      iVar4 = (int)uVar11;
    } while (iVar6 != 0);
  }
  iVar5 = (this->super_Sudoku).squared_size_;
  iVar6 = Field::value((this->super_Sudoku).fields_.
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(iVar5 * iVar7 + iVar4) * iVar5 + iVar3].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar5 = (this->super_Sudoku).squared_size_;
  Field::setValue((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [(iVar5 * iVar7 + iVar4) * iVar5 + iVar3].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar6);
  iVar5 = (this->super_Sudoku).squared_size_;
  Field::setFixed((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [(iVar5 * iVar7 + iVar4) * iVar5 + iVar3].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  if (debug) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fix field (",0xb);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") to value ",0xb);
    plVar9 = (long *)std::ostream::operator<<(poVar8,iVar6);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution(std::vector< std::shared_ptr< Field > >& testFields, int maxPossible, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int posZtoFix = 0;

  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      int x = rand() % (squared_size_);
      int y = rand() % (squared_size_);
      int z = rand() % 2;
      if(testFields[index(x,y,z)]->value() == 0)
      {
	posXtoFix = x;
	posYtoFix = y;
	posZtoFix = z;
	break;
      }
    }
  }
  else
  {
    //take the first field that has the maximum number of possibilities
    for(auto &field : testFields)
    {
      if(field->value() != 0)
	continue;

      if(field->n_possible() == maxPossible)
      {
	posXtoFix = field->pos_x();
	posYtoFix = field->pos_y();
	posZtoFix = field->pos_z();
	break;
      }
    }
  }

  int correctValue = fields_[index(posXtoFix, posYtoFix, posZtoFix)]->value();

  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setValue(correctValue);
  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<","<<posZtoFix<<") to value "<<correctValue<<std::endl;
}